

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int bbSPIClose(uint CS)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  uint32_t *puVar5;
  int iVar6;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    bbSPIClose_cold_1();
  }
  puVar5 = gpioReg;
  if (libInitialised == '\0') {
    iVar6 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIClose_cold_2();
    }
  }
  else if (CS < 0x20) {
    if (wfRx[CS].mode == 7) {
      uVar1 = wfRx[CS].field_4.I.SDA;
      bVar4 = ((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03';
      gpioReg[(ulong)uVar1 / 10] =
           wfRx[CS].field_4.s.nextBitDiff << (bVar4 & 0x1f) |
           ~(7 << (bVar4 & 0x1f)) & gpioReg[(ulong)uVar1 / 10];
      wfRx[CS].mode = 0;
      iVar2 = wfRx[CS].field_4.s.readPos;
      iVar3 = wfRx[iVar2].field_4.s.writePos;
      wfRx[iVar2].field_4.s.writePos = iVar3 + -1;
      iVar6 = 0;
      if (iVar3 < 2) {
        uVar1 = wfRx[iVar2].field_4.I.SCL;
        bVar4 = ((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03';
        puVar5[(ulong)uVar1 / 10] =
             wfRx[iVar2].field_4.s.timeout << (bVar4 & 0x1f) |
             ~(7 << (bVar4 & 0x1f)) & puVar5[(ulong)uVar1 / 10];
        uVar1 = wfRx[iVar2].field_4.s.bufSize;
        bVar4 = ((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03';
        puVar5[(ulong)uVar1 / 10] =
             wfRx[iVar2].field_4.s.startBitTick << (bVar4 & 0x1f) |
             ~(7 << (bVar4 & 0x1f)) & puVar5[(ulong)uVar1 / 10];
        uVar1 = wfRx[iVar2].field_4.s.readPos;
        bVar4 = ((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03';
        puVar5[(ulong)uVar1 / 10] =
             wfRx[iVar2].field_4.s.bit << (bVar4 & 0x1f) |
             ~(7 << (bVar4 & 0x1f)) & puVar5[(ulong)uVar1 / 10];
        iVar6 = 0;
        wfRx[wfRx[iVar2].field_4.I.SCL].mode = 0;
        wfRx[wfRx[iVar2].field_4.I.delay].mode = 0;
        wfRx[wfRx[iVar2].field_4.s.readPos].mode = 0;
      }
    }
    else {
      iVar6 = -0x8e;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        bbSPIClose_cold_3();
      }
    }
  }
  else {
    iVar6 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIClose_cold_4();
    }
  }
  return iVar6;
}

Assistant:

int bbSPIClose(unsigned CS)
{
   int SCLK;

   DBG(DBG_USER, "CS=%d", CS);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   switch(wfRx[CS].mode)
   {
      case PI_WFRX_SPI_CS:

         myGpioSetMode(wfRx[CS].S.CS, wfRx[CS].S.CSMode);
         wfRx[CS].mode = PI_WFRX_NONE;

         SCLK = wfRx[CS].S.SCLK;

         if (--wfRx[SCLK].S.usage <= 0)
         {
            myGpioSetMode(wfRx[SCLK].S.MISO, wfRx[SCLK].S.MISOMode);
            myGpioSetMode(wfRx[SCLK].S.MOSI, wfRx[SCLK].S.MOSIMode);
            myGpioSetMode(wfRx[SCLK].S.SCLK, wfRx[SCLK].S.SCLKMode);

            wfRx[wfRx[SCLK].S.MISO].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.MOSI].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.SCLK].mode = PI_WFRX_NONE;
         }

         break;

      default:

         SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

         break;

   }

   return 0;
}